

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<RegionDetector::Region*const&>::
captureExpression<(Catch::Internal::Operator)0,RegionDetector::Region*>
          (ExpressionLhs<RegionDetector::Region*const&> *this,Region **rhs)

{
  ResultBuilder *pRVar1;
  string local_80;
  string local_60;
  string local_40;
  
  pRVar1 = ResultBuilder::setResultType
                     (*(ResultBuilder **)this,(Region *)**(long **)(this + 8) == *rhs);
  StringMaker<RegionDetector::Region_*>::convert<RegionDetector::Region>
            (&local_80,(Region *)**(undefined8 **)(this + 8));
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_80);
  StringMaker<RegionDetector::Region_*>::convert<RegionDetector::Region>(&local_60,*rhs);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_60);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression(RhsT const& rhs) {
			return m_rb
				.setResultType(Internal::compare<Op>(m_lhs, rhs))
				.setLhs(Catch::toString(m_lhs))
				.setRhs(Catch::toString(rhs))
				.setOp(Internal::OperatorTraits<Op>::getName());
		}